

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshComponentRef::IsValid(ON_MeshComponentRef *this,ON_TextLog *text_log)

{
  bool bVar1;
  ON_TextLog *text_log_local;
  ON_MeshComponentRef *this_local;
  
  if (this->m_mesh == (ON_Mesh *)0x0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"m_mesh = nullptr.\n");
    }
    this_local._7_1_ = false;
  }
  else {
    bVar1 = ON_COMPONENT_INDEX::IsMeshComponentIndex(&this->m_mesh_ci);
    if (bVar1) {
      bVar1 = ON_Mesh::IsValidMeshComponentIndex(this->m_mesh,this->m_mesh_ci);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"m_mesh_ci = ");
          ON_COMPONENT_INDEX::Dump(&this->m_mesh_ci,text_log);
          ON_TextLog::Print(text_log," has an invalid m_index.\n");
        }
        this_local._7_1_ = false;
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"m_mesh_ci = ");
        ON_COMPONENT_INDEX::Dump(&this->m_mesh_ci,text_log);
        ON_TextLog::Print(text_log," has an invalid m_type.\n");
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_MeshComponentRef::IsValid( ON_TextLog* text_log ) const
{
  if ( 0 == m_mesh)
  {
    if ( 0 != text_log )
    {
      text_log->Print("m_mesh = nullptr.\n");
    }
    return false;
  }

  if ( false == m_mesh_ci.IsMeshComponentIndex() )
  {
    if ( 0 != text_log )
    {
      text_log->Print("m_mesh_ci = ");
      m_mesh_ci.Dump(*text_log);
      text_log->Print(" has an invalid m_type.\n");
    }
    return false;
  }

  if ( false == m_mesh->IsValidMeshComponentIndex(m_mesh_ci) )
  {
    if ( 0 != text_log )
    {
      text_log->Print("m_mesh_ci = ");
      m_mesh_ci.Dump(*text_log);
      text_log->Print(" has an invalid m_index.\n");
    }
    return false;
  }

  return true;
}